

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.cpp
# Opt level: O0

void __thiscall
MinVR::VRDataQueue::addSerializedQueue(VRDataQueue *this,serialData *serializedQueue)

{
  ulong uVar1;
  undefined8 uVar2;
  char *in_RSI;
  longlong timeStamp;
  int numReceived;
  int numIncluded;
  size_t end;
  size_t start;
  longlong *in_stack_fffffffffffffb58;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>
  *in_stack_fffffffffffffb60;
  allocator<char> *in_stack_fffffffffffffb90;
  string *in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  serialData *in_stack_fffffffffffffbd0;
  longlong in_stack_fffffffffffffbd8;
  VRDataQueue *in_stack_fffffffffffffbe0;
  allocator<char> local_3a0 [32];
  string local_380 [32];
  istringstream local_360 [200];
  string *in_stack_fffffffffffffd68;
  int *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  VRError *in_stack_fffffffffffffd90;
  int local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  istringstream local_1a8 [388];
  int local_24;
  undefined8 local_20;
  long local_18;
  
  uVar1 = std::__cxx11::string::size();
  if (0x11 < uVar1) {
    local_18 = 0x12;
    local_20 = std::__cxx11::string::find(in_RSI,0x15c237);
    this_00 = &local_1c8;
    std::__cxx11::string::substr((ulong)this_00,(ulong)in_RSI);
    std::__cxx11::istringstream::istringstream(local_1a8,(string *)this_00,_S_in);
    std::operator>>(in_stack_fffffffffffffb60,(int *)in_stack_fffffffffffffb58);
    std::__cxx11::istringstream::~istringstream(local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    local_18 = std::__cxx11::string::find(in_RSI,0x1625c7);
    local_1d8 = 0;
    local_18 = std::__cxx11::string::find(in_RSI,0x1625a9);
    while (local_18 != -1) {
      local_20 = std::__cxx11::string::find(in_RSI,0x1625c6);
      in_stack_fffffffffffffb98 = local_380;
      std::__cxx11::string::substr((ulong)in_stack_fffffffffffffb98,(ulong)in_RSI);
      std::__cxx11::istringstream::istringstream(local_360,in_stack_fffffffffffffb98,_S_in);
      std::operator>>(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      std::__cxx11::istringstream::~istringstream(local_360);
      std::__cxx11::string::~string(local_380);
      local_18 = std::__cxx11::string::find(in_RSI,0x1625c9);
      in_stack_fffffffffffffb90 = local_3a0;
      std::__cxx11::string::substr((ulong)in_stack_fffffffffffffb90,(ulong)in_RSI);
      push(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      std::__cxx11::string::~string((string *)local_3a0);
      local_1d8 = local_1d8 + 1;
      local_18 = std::__cxx11::string::find(in_RSI,0x1625a9);
    }
    if (local_1d8 != local_24) {
      uVar2 = __cxa_allocate_exception(0xa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      VRError::VRError(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80
                       ,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                       in_stack_fffffffffffffd68);
      __cxa_throw(uVar2,&VRError::typeinfo,VRError::~VRError);
    }
  }
  return;
}

Assistant:

void VRDataQueue::addSerializedQueue(const VRDataQueue::serialData serializedQueue) {

  // Looking for the number in <VRDataQueue num="X">
  if (serializedQueue.size() < 18) return;

  std::size_t start, end;

  start = 18;
  end = serializedQueue.find("\"", start);

  //std::cout << serializedQueue.substr(start, end - start) << std::endl;

  int numIncluded;
  std::istringstream( serializedQueue.substr(start,end)) >> numIncluded;
  start = serializedQueue.find(">", end);

  // Found the number of items.  Now parse the items, making sure to
  // record the timeStamp of each one.

  int numReceived = 0;
  long long timeStamp;
  start = serializedQueue.find("<VRDataQueueItem timeStamp=\"", start);
  while (start != std::string::npos) {

    end = serializedQueue.find("\">", start);
    // These constants have to do with the length of the tags used to
    // encode a queue.
    std::istringstream(serializedQueue.substr(start + 28, end - start - 28)) >>
      timeStamp;

    start = serializedQueue.find("</VRDataQueueItem>", end);
    push(timeStamp, serializedQueue.substr(end + 2, start - end - 2) );
    numReceived++;
    start = serializedQueue.find("<VRDataQueueItem timeStamp=\"", end);
  }

  if (numReceived != numIncluded) {
    VRERRORNOADV("Serialized queue appears corrupted.");
  }
}